

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append
          (ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT> *this,SN_ELEMENT *x)

{
  int iVar1;
  void *temp;
  SN_ELEMENT *pSStack_20;
  int newcapacity;
  SN_ELEMENT *p;
  SN_ELEMENT *x_local;
  ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT> *this_local;
  
  pSStack_20 = x;
  if (*(int *)(this + 0x10) == *(int *)(this + 0x14)) {
    iVar1 = NewCapacity(this);
    if ((*(SN_ELEMENT **)(this + 8) <= x) &&
       (x < (SN_ELEMENT *)(*(long *)(this + 8) + (long)*(int *)(this + 0x14) * 0x38))) {
      pSStack_20 = (SN_ELEMENT *)onmalloc(0x38);
      memcpy(pSStack_20,x,0x38);
    }
    Reserve(this,(long)iVar1);
    if (*(long *)(this + 8) == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar1 = *(int *)(this + 0x10);
  *(int *)(this + 0x10) = iVar1 + 1;
  memcpy((void *)(*(long *)(this + 8) + (long)iVar1 * 0x38),pSStack_20,0x38);
  if (pSStack_20 != x) {
    onfree(pSStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}